

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::ConditionalExpr::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,ConditionalExpr *this,bool ignore_top)

{
  Var *pVVar1;
  undefined7 in_register_00000011;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_40;
  undefined8 uStack_38;
  
  (*(this->condition->super_IRNode)._vptr_IRNode[0x21])(&local_80);
  pVVar1 = (this->super_Expr).left;
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x21])
            (&local_60,pVVar1,CONCAT71(in_register_00000011,ignore_top) & 0xffffffff);
  pVVar1 = (this->super_Expr).right;
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x21])(&local_40,pVVar1,ignore_top);
  local_b8 = local_80;
  uStack_b0 = uStack_78;
  local_a8 = local_60;
  uStack_a0 = uStack_58;
  local_98 = local_40;
  uStack_90 = uStack_38;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} ? {1}: {2}");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xddd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_b8;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar2.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalExpr::handle_name(bool ignore_top) const {
    return ::format("{0} ? {1}: {2}", condition->handle_name(ignore_top),
                    left->handle_name(ignore_top), right->handle_name(ignore_top));
}